

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::MILSpec::Value_ImmediateValue::MergeFrom
          (Value_ImmediateValue *this,Value_ImmediateValue *from)

{
  ulong uVar1;
  LogMessage *other;
  ListValue *this_00;
  DictionaryValue *this_01;
  TensorValue *this_02;
  TupleValue *this_03;
  undefined1 *puVar2;
  Arena *pAVar3;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O3/mlmodel/format/MIL.pb.cc"
               ,0x1599);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  switch(from->_oneof_case_[0]) {
  case 1:
    break;
  case 2:
    if (this->_oneof_case_[0] == 2) {
      this_03 = (this->value_).tuple_;
LAB_0020bae8:
      puVar2 = (undefined1 *)(from->value_).tuple_;
    }
    else {
      clear_value(this);
      this->_oneof_case_[0] = 2;
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar3 = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        pAVar3 = *(Arena **)pAVar3;
      }
      this_03 = google::protobuf::Arena::
                CreateMaybeMessage<CoreML::Specification::MILSpec::TupleValue>(pAVar3);
      (this->value_).tuple_ = this_03;
      if (from->_oneof_case_[0] == 2) goto LAB_0020bae8;
      puVar2 = _TupleValue_default_instance_;
    }
    TupleValue::MergeFrom(this_03,(TupleValue *)puVar2);
    goto switchD_0020b9b1_default;
  case 3:
    if (this->_oneof_case_[0] == 3) {
      this_00 = (this->value_).list_;
LAB_0020ba2d:
      puVar2 = (undefined1 *)(from->value_).list_;
    }
    else {
      clear_value(this);
      this->_oneof_case_[0] = 3;
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar3 = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        pAVar3 = *(Arena **)pAVar3;
      }
      this_00 = google::protobuf::Arena::
                CreateMaybeMessage<CoreML::Specification::MILSpec::ListValue>(pAVar3);
      (this->value_).list_ = this_00;
      if (from->_oneof_case_[0] == 3) goto LAB_0020ba2d;
      puVar2 = _ListValue_default_instance_;
    }
    ListValue::MergeFrom(this_00,(ListValue *)puVar2);
    goto switchD_0020b9b1_default;
  case 4:
    if (this->_oneof_case_[0] == 4) {
      this_01 = (this->value_).dictionary_;
LAB_0020ba6f:
      puVar2 = (undefined1 *)(from->value_).dictionary_;
    }
    else {
      clear_value(this);
      this->_oneof_case_[0] = 4;
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar3 = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        pAVar3 = *(Arena **)pAVar3;
      }
      this_01 = google::protobuf::Arena::
                CreateMaybeMessage<CoreML::Specification::MILSpec::DictionaryValue>(pAVar3);
      (this->value_).dictionary_ = this_01;
      if (from->_oneof_case_[0] == 4) goto LAB_0020ba6f;
      puVar2 = _DictionaryValue_default_instance_;
    }
    DictionaryValue::MergeFrom(this_01,(DictionaryValue *)puVar2);
  default:
    goto switchD_0020b9b1_default;
  }
  if (this->_oneof_case_[0] == 1) {
    this_02 = (this->value_).tensor_;
LAB_0020baad:
    puVar2 = (undefined1 *)(from->value_).tensor_;
  }
  else {
    clear_value(this);
    this->_oneof_case_[0] = 1;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    pAVar3 = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      pAVar3 = *(Arena **)pAVar3;
    }
    this_02 = google::protobuf::Arena::
              CreateMaybeMessage<CoreML::Specification::MILSpec::TensorValue>(pAVar3);
    (this->value_).tensor_ = this_02;
    if (from->_oneof_case_[0] == 1) goto LAB_0020baad;
    puVar2 = _TensorValue_default_instance_;
  }
  TensorValue::MergeFrom(this_02,(TensorValue *)puVar2);
switchD_0020b9b1_default:
  uVar1 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar1 & 0xfffffffffffffffc) + 8));
  }
  return;
}

Assistant:

void Value_ImmediateValue::MergeFrom(const Value_ImmediateValue& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.MILSpec.Value.ImmediateValue)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  switch (from.value_case()) {
    case kTensor: {
      _internal_mutable_tensor()->::CoreML::Specification::MILSpec::TensorValue::MergeFrom(from._internal_tensor());
      break;
    }
    case kTuple: {
      _internal_mutable_tuple()->::CoreML::Specification::MILSpec::TupleValue::MergeFrom(from._internal_tuple());
      break;
    }
    case kList: {
      _internal_mutable_list()->::CoreML::Specification::MILSpec::ListValue::MergeFrom(from._internal_list());
      break;
    }
    case kDictionary: {
      _internal_mutable_dictionary()->::CoreML::Specification::MILSpec::DictionaryValue::MergeFrom(from._internal_dictionary());
      break;
    }
    case VALUE_NOT_SET: {
      break;
    }
  }
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}